

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imatrix.cpp
# Opt level: O1

void __thiscall IMatrixCollector::IMatrixCollector(IMatrixCollector *this)

{
  (this->m_stats)._M_h._M_buckets = &(this->m_stats)._M_h._M_single_bucket;
  (this->m_stats)._M_h._M_bucket_count = 1;
  (this->m_stats)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_stats)._M_h._M_element_count = 0;
  (this->m_stats)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_stats)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_stats)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  common_params::common_params(&this->m_params);
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next + 4) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_src1_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_src1_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_src1_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ids).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_ids).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_ids).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IMatrixCollector() = default;